

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1dca6::
ARTScanTest_scanRangeReverse1000_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTScanTest_scanRangeReverse1000_Test
          (ARTScanTest_scanRangeReverse1000_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeReverse1000) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert_key_range(0, 1000);
  uint64_t n = 0;
  uint64_t expected = 999;
  const auto fn = [&n, &expected](
                      const unodb::visitor<typename TypeParam::iterator>&
                          v) noexcept(noexcept(v.get_key())) {
    n++;
    const auto key = decode(v.get_key());
    UNODB_EXPECT_EQ(expected, key);
    expected--;
    return false;
  };
  db.scan_range(1000, 0, fn);
  UNODB_EXPECT_EQ(999, n);  // only 999 since to_key is exclusive lower bound
}